

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O0

Col_Word Col_ConcatRopesNV(size_t number,...)

{
  long lVar1;
  char in_AL;
  Col_Word *ropes_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  Col_Word aCStack_120 [2];
  Col_Word *local_110;
  Col_Word **local_108;
  uint local_fc;
  Col_Word local_f8 [4];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  Col_Word *local_40;
  Col_Word *ropes;
  va_list args;
  size_t i;
  size_t number_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_f8[1] = in_RSI;
  local_f8[2] = in_RDX;
  local_f8[3] = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  if (number == 0) {
    aCStack_120[0] = 0x11110e;
    Col_Error(COL_VALUECHECK,ColibriDomain,0);
    number_local = 0;
  }
  else {
    lVar1 = -(number * 8 + 0xf & 0xfffffffffffffff0);
    ropes_00 = (Col_Word *)((long)aCStack_120 + lVar1 + 8);
    args[0]._0_8_ = &stack0x00000008;
    ropes._4_4_ = 0x30;
    ropes._0_4_ = 8;
    for (args[0].reg_save_area = (void *)0x0; args[0].reg_save_area < number;
        args[0].reg_save_area = (void *)((long)args[0].reg_save_area + 1)) {
      local_fc = (uint)ropes;
      if ((uint)ropes < 0x29) {
        local_110 = (Col_Word *)((long)local_f8 + (long)(int)(uint)ropes);
        ropes._0_4_ = (uint)ropes + 8;
      }
      else {
        local_110 = (Col_Word *)args[0]._0_8_;
        args[0]._0_8_ = args[0]._0_8_ + 8;
      }
      ropes_00[(long)args[0].reg_save_area] = *local_110;
      local_108 = &ropes;
    }
    local_40 = ropes_00;
    args[0].overflow_arg_area = local_f8;
    *(undefined8 *)((long)aCStack_120 + lVar1) = 0x11120a;
    number_local = Col_ConcatRopesA(number,ropes_00);
  }
  return number_local;
}

Assistant:

Col_Word
Col_ConcatRopesNV(
    size_t number,  /*!< Number of arguments following. */
    ...)            /*!< Ropes to concatenate in order. */
{
    size_t i;
    va_list args;
    Col_Word *ropes;

    /*
     * Check preconditions.
     */

    /*! @valuecheck{COL_ERROR_GENERIC,number == 0} */
    VALUECHECK(number != 0, COL_ERROR_GENERIC) return WORD_NIL;

    /*
     * Convert vararg list to array. Use alloca since a vararg list is
     * typically small.
     */

    ropes = (Col_Word *) alloca(number*sizeof(Col_Word));
    va_start(args, number);
    for (i=0; i < number; i++) {
        ropes[i] = va_arg(args, Col_Word);
    }
    va_end(args);
    return Col_ConcatRopesA(number, ropes);
}